

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderCheckMark(ImVec2 pos,ImU32 col,float sz)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  float thickness;
  value_type local_80;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  
  fStack_74 = pos.y;
  pIVar1 = GImGui->CurrentWindow;
  thickness = sz / 5.0;
  if (thickness <= 1.0) {
    thickness = 1.0;
  }
  fVar2 = sz - thickness * 0.5;
  local_58 = fVar2 / 3.0;
  local_78 = pos.x + thickness * 0.25 + local_58;
  local_38 = -local_58;
  uStack_34 = in_XMM1_Db ^ 0x80000000;
  uStack_30 = in_XMM1_Dc ^ 0x80000000;
  uStack_2c = in_XMM1_Dd ^ 0x80000000;
  local_68 = (fStack_74 + thickness * 0.25 + fVar2) - local_58 * 0.5;
  local_80.y = local_68 - local_58;
  local_80.x = local_78 - local_58;
  fStack_64 = fStack_74;
  fStack_60 = fStack_74;
  fStack_5c = fStack_74;
  local_48 = local_78;
  fStack_44 = local_68;
  fStack_40 = fStack_74;
  fStack_3c = fStack_74;
  ImVector<ImVec2>::push_back(&pIVar1->DrawList->_Path,&local_80);
  local_80.y = local_68;
  local_80.x = local_78;
  ImVector<ImVec2>::push_back(&pIVar1->DrawList->_Path,&local_80);
  local_80.y = local_38 + local_38 + fStack_44;
  local_80.x = local_58 + local_58 + local_48;
  ImVector<ImVec2>::push_back(&pIVar1->DrawList->_Path,&local_80);
  ImDrawList::PathStroke(pIVar1->DrawList,col,false,thickness);
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImVec2 pos, ImU32 col, float sz)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness*0.5f;
    pos += ImVec2(thickness*0.25f, thickness*0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third*0.5f;
    window->DrawList->PathLineTo(ImVec2(bx - third, by - third));
    window->DrawList->PathLineTo(ImVec2(bx, by));
    window->DrawList->PathLineTo(ImVec2(bx + third*2, by - third*2));
    window->DrawList->PathStroke(col, false, thickness);
}